

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# censor2.c
# Opt level: O2

int ssh2_censor_packet(PacketLogSettings *pls,int type,_Bool sender_is_client,ptrlen pkt,
                      logblank_t *blanks)

{
  BinarySource *pBVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  ptrlen pVar5;
  BinarySource src [1];
  
  src[0].len = pkt.len;
  src[0].data = pkt.ptr;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  uVar3 = 0;
  pBVar1 = src;
  if (((type & 0xfffffffeU) == 0x5e) && (pBVar1 = src, pls->omit_data != false)) {
    BinarySource_get_uint32(src);
    if (type == 0x5f) {
      BinarySource_get_uint32(src[0].binarysource_);
    }
    pVar5 = BinarySource_get_string(src[0].binarysource_);
    pBVar1 = src[0].binarysource_;
    if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
      blanks->offset = (int)src[0].pos - (int)pVar5.len;
      blanks->type = 2;
      blanks->len = (int)pVar5.len;
      uVar3 = 1;
    }
  }
  src[0].binarysource_ = pBVar1;
  uVar4 = uVar3;
  if ((sender_is_client) && (pls->omit_passwords == true)) {
    if (type == 0x32) {
      BinarySource_get_string(src[0].binarysource_);
      BinarySource_get_string(src[0].binarysource_);
      pVar5 = BinarySource_get_string(src[0].binarysource_);
      _Var2 = ptrlen_eq_string(pVar5,"password");
      if (_Var2) {
        BinarySource_get_bool(src[0].binarysource_);
        pVar5 = BinarySource_get_string(src[0].binarysource_);
        if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
          blanks[uVar3].offset = (int)src[0].pos - (int)pVar5.len;
          blanks[uVar3].type = 1;
          blanks[uVar3].len = (int)pVar5.len;
          uVar4 = uVar3 + 1;
          BinarySource_get_string(src[0].binarysource_);
          if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
            blanks[uVar3].len = (int)src[0].pos - blanks[uVar4].offset;
          }
        }
      }
    }
    else {
      if ((type == 0x3d) && (pls->actx == SSH2_PKTCTX_KBDINTER)) {
        BinarySource_get_uint32(src[0].binarysource_);
        blanks[uVar3].offset = (int)src[0].pos;
        blanks[uVar3].type = 1;
        do {
          BinarySource_get_string(src[0].binarysource_);
        } while ((src[0].binarysource_)->err == BSE_NO_ERROR);
        blanks[uVar3].len = (int)src[0].pos - blanks[uVar3].offset;
      }
      else {
        if (type != 0x62) {
          return uVar3;
        }
        BinarySource_get_uint32(src[0].binarysource_);
        pVar5 = BinarySource_get_string(src[0].binarysource_);
        _Var2 = ptrlen_eq_string(pVar5,"x11-req");
        if (!_Var2) {
          return uVar3;
        }
        BinarySource_get_bool(src[0].binarysource_);
        BinarySource_get_bool(src[0].binarysource_);
        BinarySource_get_string(src[0].binarysource_);
        pVar5 = BinarySource_get_string(src[0].binarysource_);
        if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
          return uVar3;
        }
        blanks[uVar3].offset = (int)src[0].pos - (int)pVar5.len;
        blanks[uVar3].type = 1;
        blanks[uVar3].len = (int)pVar5.len;
      }
      uVar4 = uVar3 + 1;
    }
  }
  return uVar4;
}

Assistant:

int ssh2_censor_packet(
    const PacketLogSettings *pls, int type, bool sender_is_client,
    ptrlen pkt, logblank_t *blanks)
{
    int nblanks = 0;
    ptrlen str;
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, pkt);

    if (pls->omit_data &&
        (type == SSH2_MSG_CHANNEL_DATA ||
         type == SSH2_MSG_CHANNEL_EXTENDED_DATA)) {
        /* "Session data" packets - omit the data string. */
        get_uint32(src);              /* skip channel id */
        if (type == SSH2_MSG_CHANNEL_EXTENDED_DATA)
            get_uint32(src);          /* skip extended data type */
        str = get_string(src);
        if (!get_err(src)) {
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos - str.len;
            blanks[nblanks].type = PKTLOG_OMIT;
            blanks[nblanks].len = str.len;
            nblanks++;
        }
    }

    if (sender_is_client && pls->omit_passwords) {
        if (type == SSH2_MSG_USERAUTH_REQUEST) {
            /* If this is a password packet, blank the password(s). */
            get_string(src);              /* username */
            get_string(src);              /* service name */
            str = get_string(src);        /* auth method */
            if (ptrlen_eq_string(str, "password")) {
                get_bool(src);
                /* Blank the password field. */
                str = get_string(src);
                if (!get_err(src)) {
                    assert(nblanks < MAX_BLANKS);
                    blanks[nblanks].offset = src->pos - str.len;
                    blanks[nblanks].type = PKTLOG_BLANK;
                    blanks[nblanks].len = str.len;
                    nblanks++;
                    /* If there's another password field beyond it
                     * (change of password), blank that too. */
                    str = get_string(src);
                    if (!get_err(src))
                        blanks[nblanks-1].len =
                            src->pos - blanks[nblanks].offset;
                }
            }
        } else if (pls->actx == SSH2_PKTCTX_KBDINTER &&
                   type == SSH2_MSG_USERAUTH_INFO_RESPONSE) {
            /* If this is a keyboard-interactive response packet,
             * blank the responses. */
            get_uint32(src);
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos;
            blanks[nblanks].type = PKTLOG_BLANK;
            do {
                str = get_string(src);
            } while (!get_err(src));
            blanks[nblanks].len = src->pos - blanks[nblanks].offset;
            nblanks++;
        } else if (type == SSH2_MSG_CHANNEL_REQUEST) {
            /*
             * If this is an X forwarding request packet, blank the
             * fake auth data.
             *
             * Note that while we blank the X authentication data
             * here, we don't take any special action to blank the
             * start of an X11 channel, so using MIT-MAGIC-COOKIE-1
             * and actually opening an X connection without having
             * session blanking enabled is likely to leak your cookie
             * into the log.
             */
            get_uint32(src);
            str = get_string(src);
            if (ptrlen_eq_string(str, "x11-req")) {
                get_bool(src);
                get_bool(src);
                get_string(src);
                str = get_string(src);
                if (!get_err(src)) {
                    assert(nblanks < MAX_BLANKS);
                    blanks[nblanks].offset = src->pos - str.len;
                    blanks[nblanks].type = PKTLOG_BLANK;
                    blanks[nblanks].len = str.len;
                    nblanks++;
                }
            }
        }
    }

    return nblanks;
}